

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

int Gia_ManIsoStrashReduceOne(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int i;
  
  uVar2 = (uint)*(undefined8 *)pObj;
  if (((int)uVar2 < 0) && ((uVar2 & 0x1fffffff) != 0x1fffffff)) {
    iVar1 = vSupp->nSize;
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      if (iVar1 != 1) {
        for (i = 0; i < iVar1; i = i + 1) {
          iVar1 = Vec_IntEntry(vSupp,i);
          pGVar3 = Gia_ManCi(pNew,i);
          uVar2 = Gia_Obj2Lit(pNew,pGVar3);
          pGVar3 = Gia_ManCi(p,iVar1);
          pGVar3->Value = uVar2;
          iVar1 = vSupp->nSize;
        }
        Gia_ManDupHashDfs_rec(pNew,p,pObj + -(*(ulong *)pObj & 0x1fffffff));
        iVar1 = Gia_ObjFanin0Copy(pObj);
        Gia_ManDupCleanDfs_rec(pObj + -(*(ulong *)pObj & 0x1fffffff));
        return iVar1;
      }
      iVar1 = 1;
    }
    iVar1 = Abc_Var2Lit(iVar1,uVar2 >> 0x1d & 1);
    return iVar1;
  }
  __assert_fail("Gia_ObjIsCo(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0x102b,
                "int Gia_ManIsoStrashReduceOne(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)")
  ;
}

Assistant:

int Gia_ManIsoStrashReduceOne( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    int k, iCi, iLit;
    assert( Gia_ObjIsCo(pObj) );
    if ( Vec_IntSize(vSupp) == 0 )
        return Abc_Var2Lit(0, Gia_ObjFaninC0(pObj));
    if ( Vec_IntSize(vSupp) == 1 )
        return Abc_Var2Lit(1, Gia_ObjFaninC0(pObj));
    Vec_IntForEachEntry( vSupp, iCi, k )
        Gia_ManCi(p, iCi)->Value = Gia_Obj2Lit(pNew, Gia_ManCi(pNew, k) );
    Gia_ManDupHashDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    iLit = Gia_ObjFanin0Copy(pObj);
    Gia_ManDupCleanDfs_rec( Gia_ObjFanin0(pObj) );
    return iLit;
}